

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCore.c
# Opt level: O1

Vec_Int_t * Acec_CountRemap(Gia_Man_t *pAdd,Gia_Man_t *pBase)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int *__s;
  uint uVar3;
  uint *puVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar1 = pAdd->nObjs;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  uVar3 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar3 = uVar1;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = uVar3;
  if (uVar3 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)(int)uVar3 << 2);
  }
  pVVar2->pArray = __s;
  pVVar2->nSize = uVar1;
  if (__s != (int *)0x0) {
    memset(__s,0xff,(long)(int)uVar1 << 2);
  }
  Gia_ManSetPhase(pAdd);
  if (0 < (int)uVar1) {
    *__s = 0;
    uVar3 = pAdd->nObjs;
    if ((0 < (int)uVar3) && (pAdd->pObjs != (Gia_Obj_t *)0x0)) {
      puVar4 = &pAdd->pObjs->Value;
      uVar5 = 0;
      do {
        uVar6 = (uint)*(undefined8 *)(puVar4 + -2);
        uVar7 = ~uVar6;
        if (((uVar7 & 0x9fffffff) == 0) || (-1 < (int)uVar6 && (uVar7 & 0x1fffffff) != 0)) {
          if ((int)*puVar4 < 0) {
LAB_006604c8:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          uVar6 = *puVar4 >> 1;
          if (pBase->nObjs <= (int)uVar6) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          uVar6 = pBase->pObjs[uVar6].Value;
          if ((int)uVar6 < 0) goto LAB_006604c8;
          if (uVar1 <= uVar5) goto LAB_006604e7;
          __s[uVar5] = (uint)((ulong)*(undefined8 *)(puVar4 + -2) >> 0x3f) | uVar6 & 0x7ffffffe;
        }
        uVar5 = uVar5 + 1;
        puVar4 = puVar4 + 3;
      } while (uVar3 != uVar5);
    }
    return pVVar2;
  }
LAB_006604e7:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

Vec_Int_t * Acec_CountRemap( Gia_Man_t * pAdd, Gia_Man_t * pBase )
{
    Gia_Obj_t * pObj; int i;
    Vec_Int_t * vMapNew = Vec_IntStartFull( Gia_ManObjNum(pAdd) );
    Gia_ManSetPhase( pAdd );
    Vec_IntWriteEntry( vMapNew, 0, 0 );
    Gia_ManForEachCand( pAdd, pObj, i )
    {
        int iObjBase = Abc_Lit2Var(pObj->Value);
        Gia_Obj_t * pObjBase = Gia_ManObj( pBase, iObjBase );
        int iObjRepr = Abc_Lit2Var(pObjBase->Value);
        Vec_IntWriteEntry( vMapNew, i, Abc_Var2Lit(iObjRepr, Gia_ObjPhase(pObj)) );
    }
    return vMapNew;
}